

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

void __thiscall
cfd::core::ConfidentialTransaction::SetElementsTxState(ConfidentialTransaction *this)

{
  wally_tx *tx;
  ulong uVar1;
  wally_tx_input *pwVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  size_t is_coinbase;
  size_t local_10;
  
  tx = (wally_tx *)(this->super_AbstractTransaction).wally_tx_pointer_;
  if (tx != (wally_tx *)0x0) {
    local_10 = 0;
    iVar3 = wally_tx_is_coinbase(tx,&local_10);
    if ((iVar3 == 0) && (local_10 == 0)) {
      uVar1 = tx->num_inputs;
      for (uVar4 = 0; uVar5 = (ulong)uVar4, uVar5 < uVar1; uVar4 = uVar4 + 1) {
        pwVar2 = tx->inputs;
        if ((pwVar2[uVar5].pegin_witness == (wally_tx_witness_stack *)0x0) ||
           ((pwVar2[uVar5].pegin_witness)->num_items == 0)) {
          bVar6 = pwVar2[uVar5].features & 0xfb;
        }
        else {
          bVar6 = pwVar2[uVar5].features | 4;
        }
        if (((pwVar2[uVar5].issuance_amount == (uchar *)0x0) ||
            (pwVar2[uVar5].issuance_amount_len == 0)) &&
           ((pwVar2[uVar5].inflation_keys == (uchar *)0x0 || (pwVar2[uVar5].inflation_keys_len == 0)
            ))) {
          bVar6 = bVar6 & 0xfd;
        }
        else {
          bVar6 = bVar6 | 2;
        }
        pwVar2[uVar5].features = bVar6;
      }
    }
  }
  return;
}

Assistant:

void ConfidentialTransaction::SetElementsTxState() {
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  if (tx_pointer != nullptr) {
    size_t is_coinbase = 0;
    // coinbase priority when coinbase is set
    int ret = wally_tx_is_coinbase(tx_pointer, &is_coinbase);
    if ((ret == WALLY_OK) && (is_coinbase == 0)) {
      for (uint32_t i = 0; i < tx_pointer->num_inputs; ++i) {
        struct wally_tx_input *input = tx_pointer->inputs + i;
        // pegin_witness
        if ((input->pegin_witness != nullptr) &&
            (input->pegin_witness->num_items != 0)) {
          input->features |= kTxInFeaturePegin;
        } else {
          input->features &= ~kTxInFeaturePegin;
        }

        // issuance
        if (((input->issuance_amount != nullptr) &&
             (input->issuance_amount_len != 0)) ||
            ((input->inflation_keys != nullptr) &&
             (input->inflation_keys_len != 0))) {
          input->features |= kTxInFeatureIssuance;
        } else {
          input->features &= ~kTxInFeatureIssuance;
        }
      }
    }
  }
}